

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol(Tables *this,string *full_name,Symbol symbol)

{
  pointer *pppcVar1;
  iterator __position;
  pair<std::__detail::_Node_iterator<std::pair<const_char_*const,_google::protobuf::Symbol>,_false,_true>,_bool>
  pVar2;
  __node_gen_type __node_gen;
  pointer local_38;
  Type local_30;
  anon_union_8_8_13f84498_for_Symbol_2 local_28;
  SymbolsByNameMap *local_20;
  
  local_28 = symbol.field_1;
  local_20 = &this->symbols_by_name_;
  local_38 = (full_name->_M_dataplus)._M_p;
  local_30 = symbol.type;
  pVar2 = std::
          _Hashtable<char_const*,std::pair<char_const*const,google::protobuf::Symbol>,std::allocator<std::pair<char_const*const,google::protobuf::Symbol>>,std::__detail::_Select1st,google::protobuf::streq,google::protobuf::hash<char_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_insert<std::pair<char_const*const,google::protobuf::Symbol>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<char_const*const,google::protobuf::Symbol>,true>>>>
                    ();
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_38 = (full_name->_M_dataplus)._M_p;
    __position._M_current =
         (this->symbols_after_checkpoint_).
         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->symbols_after_checkpoint_).
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&this->symbols_after_checkpoint_
                 ,__position,&local_38);
    }
    else {
      *__position._M_current = local_38;
      pppcVar1 = &(this->symbols_after_checkpoint_).
                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  return (bool)(pVar2.second & 1);
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(
    const string& full_name, Symbol symbol) {
  if (InsertIfNotPresent(&symbols_by_name_, full_name.c_str(), symbol)) {
    symbols_after_checkpoint_.push_back(full_name.c_str());
    return true;
  } else {
    return false;
  }
}